

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O0

void Handlers::StatSkill_Take(Character *character,PacketReader *reader)

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  unsigned_short spell_00;
  int iVar4;
  NPC_Data *pNVar5;
  pointer pNVar6;
  iterator pvVar7;
  undefined1 local_130 [8];
  PacketBuilder reply;
  PacketBuilder reply_3;
  value_type_conflict4 req;
  iterator __end4;
  iterator __begin4;
  array<short,_4UL> *__range4;
  PacketBuilder reply_2;
  undefined1 local_70 [8];
  PacketBuilder reply_1;
  unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *spell;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
  *__range2;
  short spell_id;
  PacketReader *reader_local;
  Character *character_local;
  
  PacketReader::GetInt(reader);
  spell_00 = PacketReader::GetShort(reader);
  bVar3 = Character::HasSpell(character,spell_00);
  if ((!bVar3) && (character->npc_type == Skills)) {
    pNVar5 = NPC::Data(character->npc);
    __end2 = std::
             vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
             ::begin(&pNVar5->skill_learn);
    spell = (unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
            std::
            vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
            ::end(&pNVar5->skill_learn);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_*,_std::vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>_>
                                       *)&spell), bVar3) {
      reply_1.add_size =
           (size_t)__gnu_cxx::
                   __normal_iterator<const_std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_*,_std::vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>_>
                   ::operator*(&__end2);
      pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::operator->
                         ((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                          reply_1.add_size);
      if ((uint)pNVar6->id == (int)(short)spell_00) {
        bVar1 = character->level;
        pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::operator->
                           ((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                            reply_1.add_size);
        if (pNVar6->levelreq <= bVar1) {
          iVar4 = Character::HasItem(character,1,false);
          pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                   operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *)
                              reply_1.add_size);
          if (((((pNVar6->cost <= iVar4) &&
                (iVar4 = *character->display_str,
                pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                         operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     *)reply_1.add_size), pNVar6->strreq <= iVar4)) &&
               (iVar4 = *character->display_intl,
               pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                        operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                    *)reply_1.add_size), pNVar6->intreq <= iVar4)) &&
              ((iVar4 = *character->display_wis,
               pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                        operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                    *)reply_1.add_size), pNVar6->wisreq <= iVar4 &&
               (iVar4 = *character->display_agi,
               pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                        operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                    *)reply_1.add_size), pNVar6->agireq <= iVar4)))) &&
             ((iVar4 = *character->display_con,
              pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                       operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                   *)reply_1.add_size), pNVar6->conreq <= iVar4 &&
              (iVar4 = *character->display_cha,
              pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                       operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                   *)reply_1.add_size), pNVar6->chareq <= iVar4)))) {
            pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                     operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                 *)reply_1.add_size);
            if ((pNVar6->classreq != '\0') &&
               (uVar2 = character->clas,
               pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                        operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                    *)reply_1.add_size), uVar2 != pNVar6->classreq)) {
              PacketBuilder::PacketBuilder
                        ((PacketBuilder *)&__range4,PACKET_STATSKILL,PACKET_REPLY,4);
              PacketBuilder::AddShort((PacketBuilder *)&__range4,2);
              PacketBuilder::AddShort((PacketBuilder *)&__range4,(uint)character->clas);
              Character::Send(character,(PacketBuilder *)&__range4);
              PacketBuilder::~PacketBuilder((PacketBuilder *)&__range4);
              return;
            }
            pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                     operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                 *)reply_1.add_size);
            __end4 = std::array<short,_4UL>::begin(&pNVar6->skillreq);
            pvVar7 = std::array<short,_4UL>::end(&pNVar6->skillreq);
            while( true ) {
              if (__end4 == pvVar7) {
                pNVar6 = std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>::
                         operator->((unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                     *)reply_1.add_size);
                Character::DelItem(character,1,pNVar6->cost);
                Character::AddSpell(character,spell_00);
                PacketBuilder::PacketBuilder
                          ((PacketBuilder *)local_130,PACKET_STATSKILL,PACKET_TAKE,6);
                PacketBuilder::AddShort((PacketBuilder *)local_130,(int)(short)spell_00);
                iVar4 = Character::HasItem(character,1,false);
                PacketBuilder::AddInt((PacketBuilder *)local_130,iVar4);
                Character::Send(character,(PacketBuilder *)local_130);
                PacketBuilder::~PacketBuilder((PacketBuilder *)local_130);
                return;
              }
              if ((*__end4 != 0) && (bVar3 = Character::HasSpell(character,*__end4), !bVar3)) break;
              __end4 = __end4 + 1;
            }
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)&reply.add_size,PACKET_STATSKILL,PACKET_REPLY,4);
            PacketBuilder::AddShort((PacketBuilder *)&reply.add_size,2);
            PacketBuilder::AddShort((PacketBuilder *)&reply.add_size,(uint)character->clas);
            Character::Send(character,(PacketBuilder *)&reply.add_size);
            PacketBuilder::~PacketBuilder((PacketBuilder *)&reply.add_size);
            return;
          }
        }
        PacketBuilder::PacketBuilder((PacketBuilder *)local_70,PACKET_STATSKILL,PACKET_REPLY,4);
        PacketBuilder::AddShort((PacketBuilder *)local_70,2);
        PacketBuilder::AddShort((PacketBuilder *)local_70,(uint)character->clas);
        Character::Send(character,(PacketBuilder *)local_70);
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_70);
        return;
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_*,_std::vector<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void StatSkill_Take(Character *character, PacketReader &reader)
{
	/*int shopid = */reader.GetInt();
	short spell_id = reader.GetShort();

	if (character->HasSpell(spell_id))
		return;

	if (character->npc_type == ENF::Skills)
	{
		UTIL_FOREACH_CREF(character->npc->Data().skill_learn, spell)
		{
			if (spell->id == spell_id)
			{
				if (character->level < spell->levelreq || character->HasItem(1) < spell->cost
				 || character->display_str < spell->strreq || character->display_intl < spell->intreq
				 || character->display_wis < spell->wisreq || character->display_agi < spell->agireq
				 || character->display_con < spell->conreq || character->display_cha < spell->chareq)
				{
					// No correct reply for these
					PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
					reply.AddShort(SKILLMASTER_WRONG_CLASS);
					reply.AddShort(character->clas);
					character->Send(reply);
					return;
				}

				if (spell->classreq != 0 && character->clas != spell->classreq)
				{
					PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
					reply.AddShort(SKILLMASTER_WRONG_CLASS);
					reply.AddShort(character->clas);
					character->Send(reply);
					return;
				}

				UTIL_FOREACH(spell->skillreq, req)
				{
					if (req != 0 && !character->HasSpell(req))
					{
						// No correct reply for this
						PacketBuilder reply(PACKET_STATSKILL, PACKET_REPLY, 4);
						reply.AddShort(SKILLMASTER_WRONG_CLASS);
						reply.AddShort(character->clas);
						character->Send(reply);
						return;
					}
				}

				character->DelItem(1, spell->cost);
				character->AddSpell(spell_id);

				PacketBuilder reply(PACKET_STATSKILL, PACKET_TAKE, 6);
				reply.AddShort(spell_id);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);

				break;
			}
		}
	}
}